

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::anon_unknown_0::FileContainsExtensions
               (FileDescriptor *file)

{
  bool bVar1;
  ulong uVar2;
  Descriptor *message;
  ulong uVar3;
  
  bVar1 = true;
  if (*(int *)(file + 0x3c) < 1) {
    uVar3 = (ulong)*(int *)(file + 0x2c);
    if ((long)uVar3 < 1) {
      bVar1 = false;
    }
    else {
      message = *(Descriptor **)(file + 0x58);
      uVar2 = 0;
      do {
        bVar1 = MessageContainsExtensions(message);
        if (bVar1) {
          return true;
        }
        uVar2 = uVar2 + 1;
        message = message + 0x88;
      } while (uVar3 != uVar2);
      bVar1 = uVar2 < uVar3;
    }
  }
  return bVar1;
}

Assistant:

bool FileContainsExtensions(const FileDescriptor* file) {
  if (file->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageContainsExtensions(file->message_type(i))) {
      return true;
    }
  }
  return false;
}